

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall
spv::Builder::makeSwitch
          (Builder *this,Id selector,uint control,int numSegments,Vector<int> *caseValues,
          Vector<int> *valueIndexToSegment,int defaultSegment,Vector<Block_*> *segmentBlocks)

{
  Vector<Id> *this_00;
  iterator *piVar1;
  Function *parent;
  iterator iVar2;
  _Elt_pointer ppBVar3;
  Vector<int> *pVVar4;
  Block *pBVar5;
  Instruction *instruction;
  pointer piVar6;
  Block **ppBVar7;
  Id IVar8;
  Instruction *raw_instruction;
  long lVar9;
  uint local_54;
  Block *local_50;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  uint local_40;
  uint local_3c;
  Vector<int> *local_38;
  
  parent = this->buildPoint->parent;
  local_40 = control;
  local_3c = selector;
  local_38 = valueIndexToSegment;
  if (0 < numSegments) {
    do {
      pBVar5 = (Block *)::dxil_spv::allocate_in_thread(0x78);
      IVar8 = this->uniqueId + 1;
      this->uniqueId = IVar8;
      Block::Block(pBVar5,IVar8,parent);
      local_50 = pBVar5;
      std::vector<spv::Block*,dxil_spv::ThreadLocalAllocator<spv::Block*>>::
      emplace_back<spv::Block*>
                ((vector<spv::Block*,dxil_spv::ThreadLocalAllocator<spv::Block*>> *)segmentBlocks,
                 &local_50);
      numSegments = numSegments + -1;
    } while (numSegments != 0);
  }
  pBVar5 = (Block *)::dxil_spv::allocate_in_thread(0x78);
  IVar8 = this->uniqueId + 1;
  this->uniqueId = IVar8;
  Block::Block(pBVar5,IVar8,parent);
  local_50 = pBVar5;
  createSelectionMerge(this,pBVar5,local_40);
  instruction = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
  instruction->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
  instruction->resultId = 0;
  instruction->typeId = 0;
  instruction->opCode = OpSwitch;
  this_00 = &instruction->operands;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  instruction->block = (Block *)0x0;
  local_54 = local_3c;
  iVar2._M_current =
       (instruction->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (instruction->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar2,
               &local_54);
  }
  else {
    *iVar2._M_current = local_3c;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  ppBVar7 = &local_50;
  if (-1 < defaultSegment) {
    ppBVar7 = (segmentBlocks->
              super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>).
              _M_impl.super__Vector_impl_data._M_start + (uint)defaultSegment;
  }
  pBVar5 = *ppBVar7;
  local_54 = *(uint *)((long)(((pBVar5->instructions).
                               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                             ._M_t + 8);
  iVar2._M_current =
       (instruction->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (instruction->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar2,
               &local_54);
  }
  else {
    *iVar2._M_current = local_54;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  Block::addPredecessor(pBVar5,this->buildPoint);
  pVVar4 = local_38;
  piVar6 = (caseValues->super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(caseValues->
                              super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>)._M_impl
                              .super__Vector_impl_data._M_finish - (long)piVar6) >> 2)) {
    lVar9 = 0;
    do {
      local_54 = piVar6[lVar9];
      iVar2._M_current =
           (instruction->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (instruction->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,
                   iVar2,&local_54);
      }
      else {
        *iVar2._M_current = local_54;
        (instruction->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      local_54 = *(uint *)(**(long **)&((segmentBlocks->
                                        super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start
                                        [(pVVar4->
                                         super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>
                                         )._M_impl.super__Vector_impl_data._M_start[lVar9]]->
                                       instructions).
                                       super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                       ._M_impl.super__Vector_impl_data + 8);
      iVar2._M_current =
           (instruction->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (instruction->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,
                   iVar2,&local_54);
      }
      else {
        *iVar2._M_current = local_54;
        (instruction->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      Block::addPredecessor
                ((segmentBlocks->
                 super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>).
                 _M_impl.super__Vector_impl_data._M_start
                 [(pVVar4->super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar9]],this->buildPoint);
      lVar9 = lVar9 + 1;
      piVar6 = (caseValues->super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar9 < (int)((ulong)((long)(caseValues->
                                         super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)piVar6)
                          >> 2));
  }
  pBVar5 = this->buildPoint;
  local_48._M_head_impl = instruction;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar5->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_48);
  instruction->block = pBVar5;
  if (instruction->resultId != 0) {
    Module::mapInstruction(pBVar5->parent->parent,instruction);
  }
  if (local_48._M_head_impl != (Instruction *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Instruction[1])();
  }
  local_48._M_head_impl = (Instruction *)0x0;
  ppBVar3 = (this->switchMerges).c.super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppBVar3 ==
      (this->switchMerges).c.super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<spv::Block*,std::allocator<spv::Block*>>::_M_push_back_aux<spv::Block*const&>
              ((deque<spv::Block*,std::allocator<spv::Block*>> *)&this->switchMerges,&local_50);
  }
  else {
    *ppBVar3 = local_50;
    piVar1 = &(this->switchMerges).c.super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void Builder::makeSwitch(Id selector, unsigned int control, int numSegments, const dxil_spv::Vector<int>& caseValues,
                         const dxil_spv::Vector<int>& valueIndexToSegment, int defaultSegment,
                         dxil_spv::Vector<Block*>& segmentBlocks)
{
    Function& function = buildPoint->getParent();

    // make all the blocks
    for (int s = 0; s < numSegments; ++s)
        segmentBlocks.push_back(new Block(getUniqueId(), function));

    Block* mergeBlock = new Block(getUniqueId(), function);

    // make and insert the switch's selection-merge instruction
    createSelectionMerge(mergeBlock, control);

    // make the switch instruction
    Instruction* switchInst = new Instruction(NoResult, NoType, OpSwitch);
    switchInst->addIdOperand(selector);
    auto defaultOrMerge = (defaultSegment >= 0) ? segmentBlocks[defaultSegment] : mergeBlock;
    switchInst->addIdOperand(defaultOrMerge->getId());
    defaultOrMerge->addPredecessor(buildPoint);
    for (int i = 0; i < (int)caseValues.size(); ++i) {
        switchInst->addImmediateOperand(caseValues[i]);
        switchInst->addIdOperand(segmentBlocks[valueIndexToSegment[i]]->getId());
        segmentBlocks[valueIndexToSegment[i]]->addPredecessor(buildPoint);
    }
    buildPoint->addInstruction(std::unique_ptr<Instruction>(switchInst));

    // push the merge block
    switchMerges.push(mergeBlock);
}